

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O2

void __thiscall DemoScripts::RunDummyModel(DemoScripts *this)

{
  ostream *poVar1;
  pointer pfVar2;
  initializer_list<float> __l;
  allocator_type local_e9;
  vector<float,_std::allocator<float>_> output;
  _Vector_base<float,_std::allocator<float>_> local_d0;
  float local_b8 [6];
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> model;
  
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::BasicNetwork(&model,1,1,true);
  INetwork::AddLink(&model.super_INetwork,0,1,100.0,0.1);
  INetwork::AddLink(&model.super_INetwork,0,2,100.0,0.15);
  INetwork::AddLink(&model.super_INetwork,0,3,100.0,0.05);
  INetwork::AddLink(&model.super_INetwork,0,4,100.0,0.2);
  std::vector<float,_std::allocator<float>_>::vector(&output,1,(allocator_type *)&local_d0);
  local_b8[0] = 0.5;
  local_b8[1] = 100.0;
  local_b8[2] = 100.0;
  local_b8[3] = 100.0;
  __l._M_len = 4;
  __l._M_array = local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_d0,__l,&local_e9);
  INetwork::Forward(&model.super_INetwork,(Sample *)&local_d0,&output,4.0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d0);
  for (pfVar2 = output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar2 != output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish; pfVar2 = pfVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pfVar2);
    std::operator<<(poVar1," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&output.super__Vector_base<float,_std::allocator<float>_>);
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::~BasicNetwork(&model);
  return;
}

Assistant:

void DemoScripts::RunDummyModel()
{
    const int INPUT_SIZE = 1;
    const int OUTPUT_SIZE = 1;
    auto model = BasicNetwork<LifNeuron, LifSynapse, PreciseEventManager>( INPUT_SIZE, OUTPUT_SIZE, true );

    model.AddLink( 0, 1, 100, 0.1 );
    model.AddLink( 0, 2, 100, 0.15 );
    model.AddLink( 0, 3, 100, 0.05 );
    model.AddLink( 0, 4, 100, 0.2 );

    std::vector<float> output( OUTPUT_SIZE );

    model.Forward( {0.5, 100, 100, 100}, output, 4 );

    for ( auto activation: output ) {
        std::cout << activation << " ";
    }
    std::cout << "\n";
}